

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::Do_Call<unsigned_long>::
go<unsigned_long(std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&,std::__cxx11::string_const&),chaiscript::dispatch::detail::Fun_Caller<unsigned_long,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&,std::__cxx11::string_const&>>
          (Do_Call<unsigned_long> *this,
          Fun_Caller<unsigned_long,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *fun,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  Result_Type pmVar1;
  Result_Type pbVar2;
  unsigned_long t;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  Boxed_Value BVar4;
  
  pmVar1 = boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&>
                     ((params->
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      )._M_impl.super__Vector_impl_data._M_start,t_conversions);
  pbVar2 = boxed_cast<std::__cxx11::string_const&>
                     ((params->
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1,t_conversions);
  t = (*fun->m_func)(pmVar1,pbVar2);
  sVar3 = Boxed_Value::Object_Data::get<unsigned_long>((Object_Data *)this,t,true);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }